

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Net::~Net(Net *this)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *unaff_retaddr;
  
  clear(this);
  std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::~vector
            ((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *)
             unaff_retaddr);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)unaff_retaddr);
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

Net::~Net()
{
    clear();

#if NCNN_VULKAN
    delete cast_float32_to_float16;
    delete cast_float16_to_float32;
    delete packing_pack1;
    delete packing_pack4;
#endif // NCNN_VULKAN
}